

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::polygon
          (Fl_PostScript_Graphics_Driver *this,int x0,int y0,int x1,int y1,int x2,int y2,int x3,
          int y3)

{
  fwrite("GS\n",3,1,(FILE *)this->output);
  fwrite("BP\n",3,1,(FILE *)this->output);
  fprintf((FILE *)this->output,"%i %i MT\n",(ulong)(uint)x0,(ulong)(uint)y0);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x1,(ulong)(uint)y1);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x2,(ulong)(uint)y2);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x3,(ulong)(uint)y3);
  fwrite("EFP\n",4,1,(FILE *)this->output);
  fwrite("GR\n",3,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::polygon(int x0, int y0, int x1, int y1, int x2, int y2, int x3, int y3) {
  fprintf(output, "GS\n");
  fprintf(output,"BP\n");
  fprintf(output, "%i %i MT\n", x0 , y0 );
  fprintf(output, "%i %i LT\n", x1 , y1 );
  fprintf(output, "%i %i LT\n", x2 , y2 );
  fprintf(output, "%i %i LT\n", x3 , y3 );
  
  fprintf(output, "EFP\n");
  fprintf(output, "GR\n");
}